

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O1

uint8_t * __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::StringToInt64Map_MapEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3>
::_InternalSerialize
          (MapEntryImpl<CoreML::Specification::StringToInt64Map_MapEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3>
           *this,uint8_t *ptr,EpsCopyOutputStream *stream)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t *ptr_00;
  uint8_t *puVar6;
  string *s;
  
  iVar2 = (*(this->super_MessageLite)._vptr_MessageLite[0xd])();
  s = (string *)CONCAT44(extraout_var,iVar2);
  if (stream->end_ <= ptr) {
    ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
  }
  __n = s->_M_string_length;
  if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)ptr)))) {
    *ptr = '\n';
    ptr[1] = (uint8_t)__n;
    memcpy(ptr + 2,(s->_M_dataplus)._M_p,__n);
    ptr_00 = ptr + __n + 2;
  }
  else {
    ptr_00 = io::EpsCopyOutputStream::WriteStringOutline(stream,1,s,ptr);
  }
  iVar2 = (*(this->super_MessageLite)._vptr_MessageLite[0xe])(this);
  if (stream->end_ <= ptr_00) {
    ptr_00 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr_00);
  }
  uVar3 = *(ulong *)CONCAT44(extraout_var_00,iVar2);
  *ptr_00 = '\x10';
  ptr_00[1] = (byte)uVar3;
  if (uVar3 < 0x80) {
    puVar6 = ptr_00 + 2;
  }
  else {
    ptr_00[1] = (byte)uVar3 | 0x80;
    ptr_00[2] = (uint8_t)(uVar3 >> 7);
    puVar6 = ptr_00 + 3;
    if (0x3fff < uVar3) {
      uVar5 = (ulong)ptr_00[2];
      uVar3 = uVar3 >> 7;
      do {
        puVar6[-1] = (byte)uVar5 | 0x80;
        uVar4 = uVar3 >> 7;
        *puVar6 = (uint8_t)uVar4;
        puVar6 = puVar6 + 1;
        uVar5 = uVar4 & 0xffffffff;
        bVar1 = 0x3fff < uVar3;
        uVar3 = uVar4;
      } while (bVar1);
    }
  }
  return puVar6;
}

Assistant:

::uint8_t* _InternalSerialize(
      ::uint8_t* ptr, io::EpsCopyOutputStream* stream) const override {
    ptr = KeyTypeHandler::Write(kKeyFieldNumber, key(), ptr, stream);
    return ValueTypeHandler::Write(kValueFieldNumber, value(), ptr, stream);
  }